

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_ignoreOtherCallsDoesntIgnoreMultipleCallsOfTheSameFunction_TestShell::
TEST_MockCallTest_ignoreOtherCallsDoesntIgnoreMultipleCallsOfTheSameFunction_TestShell
          (TEST_MockCallTest_ignoreOtherCallsDoesntIgnoreMultipleCallsOfTheSameFunction_TestShell
           *this)

{
  TEST_MockCallTest_ignoreOtherCallsDoesntIgnoreMultipleCallsOfTheSameFunction_TestShell *this_local
  ;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)
       &
       PTR__TEST_MockCallTest_ignoreOtherCallsDoesntIgnoreMultipleCallsOfTheSameFunction_TestShell_00356e18
  ;
  return;
}

Assistant:

TEST(MockCallTest, ignoreOtherCallsDoesntIgnoreMultipleCallsOfTheSameFunction)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foo")->callWasMade(1);
    MockUnexpectedCallHappenedFailure expectedFailure(mockFailureTest(), "foo", expectations);

    mock().expectOneCall("foo");
    mock().ignoreOtherCalls();
    mock().actualCall("bar");
    mock().actualCall("foo");
    mock().actualCall("foo");

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}